

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  internal *local_b0;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  allocator local_41;
  string local_40 [8];
  string file_name;
  int line_local;
  char *file_local;
  
  file_name.field_2._12_4_ = SUB84(file,0);
  local_b0 = this;
  if (this == (internal *)0x0) {
    local_b0 = (internal *)0x1a05db;
  }
  __rhs = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)local_b0,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((int)file_name.field_2._12_4_ < 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  }
  else {
    std::operator+(in_stack_ffffffffffffff68,(char *)__rhs);
    StreamableToString<int>
              ((string *)&stack0xffffffffffffff68,(int *)(file_name.field_2._M_local_buf + 0xc));
    std::operator+(__return_storage_ptr__,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_58 = 1;
  std::__cxx11::string::~string(local_40);
  return __rhs;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}